

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::setStyle_helper(QWidgetPrivate *this,QStyle *newStyle,bool propagate)

{
  QWidget *this_00;
  QObject **ppQVar1;
  ulong uVar2;
  QWidgetPrivate *this_01;
  Data *pDVar3;
  QStyle *pQVar4;
  QStyleSheetStyle *pQVar5;
  QWExtra *pQVar6;
  QObject *pQVar7;
  int i;
  ulong uVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QObject_*> local_68;
  QWeakPointer<QObject> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar4 = QWidget::style(this_00);
  createExtra(this);
  pQVar6 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  local_48.d = (pQVar6->style).wp.d;
  local_48.value = *(QObject **)((long)&(pQVar6->style).wp + 8);
  if (local_48.d != (Data *)0x0) {
    LOCK();
    *(int *)local_48.d = *(int *)local_48.d + 1;
    UNLOCK();
    pQVar6 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  QWeakPointer<QObject>::assign<QObject>(&(pQVar6->style).wp,&newStyle->super_QObject);
  if ((this->polished != (QMetaObject *)0x0) &&
     ((char)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i != '\x11')) {
    (**(code **)(*(long *)pQVar4 + 0x68))(pQVar4,this_00);
    pQVar4 = QWidget::style(this_00);
    (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,this_00);
  }
  if (propagate) {
    local_68.d = *(Data **)&this->field_0x18;
    ppQVar1 = *(QObject ***)&this->field_0x20;
    uVar2 = *(ulong *)&this->field_0x28;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.ptr = ppQVar1;
    local_68.size = uVar2;
    for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
      pQVar7 = ppQVar1[uVar8];
      if ((pQVar7 != (QObject *)0x0) &&
         (this_01 = *(QWidgetPrivate **)(pQVar7 + 8), (this_01->field_0x30 & 1) != 0)) {
        inheritStyle(this_01);
      }
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_68);
  }
  pQVar5 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(&newStyle->super_QObject);
  pDVar3 = local_48.d;
  if (pQVar5 == (QStyleSheetStyle *)0x0) {
    if ((local_48.d == (Data *)0x0) || (pQVar7 = local_48.value, *(int *)(local_48.d + 4) == 0)) {
      pQVar7 = (QObject *)0x0;
    }
    pQVar5 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(pQVar7);
    if (pQVar5 != (QStyleSheetStyle *)0x0) {
      QStyleSheetStyle::clearWidgetFont((QStyleSheetStyle *)pQVar5,this_00);
    }
  }
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_68,StyleChange);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_68);
  if ((pDVar3 == (Data *)0x0) || (pQVar7 = local_48.value, *(int *)(pDVar3 + 4) == 0)) {
    pQVar7 = (QObject *)0x0;
  }
  pQVar5 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(pQVar7);
  if (pQVar5 != (QStyleSheetStyle *)0x0) {
    QStyleSheetStyle::deref((QStyleSheetStyle *)pQVar5);
  }
  QEvent::~QEvent((QEvent *)&local_68);
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setStyle_helper(QStyle *newStyle, bool propagate)
{
    Q_Q(QWidget);
    QStyle *oldStyle = q->style();

    createExtra();

#ifndef QT_NO_STYLE_STYLESHEET
    QPointer<QStyle> origStyle = extra->style;
#endif
    extra->style = newStyle;

    // repolish
    if (polished && q->windowType() != Qt::Desktop) {
        oldStyle->unpolish(q);
        q->style()->polish(q);
    }

    if (propagate) {
        // We copy the list because the order may be modified
        const QObjectList childrenList = children;
        for (int i = 0; i < childrenList.size(); ++i) {
            QWidget *c = qobject_cast<QWidget*>(childrenList.at(i));
            if (c)
                c->d_func()->inheritStyle();
        }
    }

#ifndef QT_NO_STYLE_STYLESHEET
    if (!qt_styleSheet(newStyle)) {
        if (const QStyleSheetStyle* cssStyle = qt_styleSheet(origStyle)) {
            cssStyle->clearWidgetFont(q);
        }
    }
#endif

    QEvent e(QEvent::StyleChange);
    QCoreApplication::sendEvent(q, &e);

#ifndef QT_NO_STYLE_STYLESHEET
    // dereference the old stylesheet style
    if (QStyleSheetStyle *proxy = qt_styleSheet(origStyle))
        proxy->deref();
#endif
}